

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::check_max_selection_weight_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_ba0;
  pointer local_b98;
  char *local_b90;
  char *local_b88;
  pointer local_b80;
  pointer local_b78;
  char *local_b70;
  char *local_b68;
  pointer local_b60;
  pointer local_b58;
  char *local_b50;
  char *local_b48;
  pointer local_b40;
  pointer local_b38;
  char *local_b30;
  char *local_b28;
  pointer local_b20;
  pointer local_b18;
  char *local_b10;
  char *local_b08;
  basic_wrap_stringstream<char> local_b00;
  check_max_selection_weight t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b08 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"check_max_selection_weight");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b20 = (pbVar3->_M_dataplus)._M_p;
  local_b18 = local_b20 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x58a;
  file.m_begin = (iterator)&local_b10;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b20,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  check_max_selection_weight::check_max_selection_weight(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b28 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"check_max_selection_weight");
  std::operator<<((ostream *)&local_b00,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b40 = (pbVar3->_M_dataplus)._M_p;
  local_b38 = local_b40 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x58a;
  file_00.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b40,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b48 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"check_max_selection_weight");
  std::operator<<((ostream *)&local_b00,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b60 = (pbVar3->_M_dataplus)._M_p;
  local_b58 = local_b60 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x58a;
  file_01.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b60,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  check_max_selection_weight::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b68 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"check_max_selection_weight");
  std::operator<<((ostream *)&local_b00,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b80 = (pbVar3->_M_dataplus)._M_p;
  local_b78 = local_b80 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x58a;
  file_02.m_begin = (iterator)&local_b70;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b80,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b88 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"check_max_selection_weight");
  std::operator<<((ostream *)&local_b00,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_ba0 = (pbVar3->_M_dataplus)._M_p;
  local_b98 = local_ba0 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x58a;
  file_03.m_begin = (iterator)&local_b90;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_ba0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_max_selection_weight)
{
    const CAmount target = 49.5L * COIN;
    CCoinControl cc;

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/68,
        /*min_change_target=*/CENT,
        /*effective_feerate=*/CFeeRate(0),
        /*long_term_feerate=*/CFeeRate(0),
        /*discard_feerate=*/CFeeRate(0),
        /*tx_noinputs_size=*/10 + 34, // static header size + output size
        /*avoid_partial=*/false,
    };

    int max_weight = MAX_STANDARD_TX_WEIGHT - WITNESS_SCALE_FACTOR * (cs_params.tx_noinputs_size + cs_params.change_output_size);
    {
        // Scenario 1:
        // The actor starts with 1x 50.0 BTC and 1515x 0.033 BTC (~100.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // The 50.0 BTC output should be selected, because the transaction would otherwise be too large

        // Perform selection

        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }

                add_coin(available_coins, wallet, CAmount(50 * COIN), CFeeRate(0), 144, false, 0, true);
                return available_coins;
            },
            m_node);

        BOOST_CHECK(result);
        // Verify that the 50 BTC UTXO was selected, and result is below max_weight
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(50 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 2:

        // The actor starts with 400x 0.0625 BTC and 2000x 0.025 BTC (75.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // A combination of coins should be selected, such that the created transaction is not too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 400; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.0625 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                for (int j = 0; j < 2000; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.025 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.0625 * COIN)));
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.025 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 3:

        // The actor starts with 1515x 0.033 BTC (49.995 BTC total) unspent outputs
        // No results should be returned, because the transaction would be too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        // No results
        // 1515 inputs * 68 bytes = 103,020 bytes
        // 103,020 bytes * 4 = 412,080 weight, which is above the MAX_STANDARD_TX_WEIGHT of 400,000
        BOOST_CHECK(!result);
    }
}